

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

void __thiscall QHttpNetworkReplyPrivate::clearHttpLayerInformation(QHttpNetworkReplyPrivate *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0xd0) = 0;
  *(undefined8 *)(in_RDI + 0x108) = 0;
  *(undefined8 *)(in_RDI + 0x110) = 0;
  *(undefined8 *)(in_RDI + 0x118) = 0;
  *(undefined8 *)(in_RDI + 0x140) = 0;
  *(undefined8 *)(in_RDI + 0x148) = 0;
  *(undefined1 *)(in_RDI + 0x13b) = 0;
  *(undefined1 *)(in_RDI + 0x139) = 1;
  QHttpHeaderParser::clear((QHttpHeaderParser *)this);
  return;
}

Assistant:

void QHttpNetworkReplyPrivate::clearHttpLayerInformation()
{
    state = NothingDoneState;
    bodyLength = 0;
    contentRead = 0;
    totalProgress = 0;
    currentChunkSize = 0;
    currentChunkRead = 0;
    lastChunkRead = false;
    connectionCloseEnabled = true;
    parser.clear();
}